

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"networks/sis33.m",&local_29);
  BasicTests::Capacitor_Test_GA(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main() {
//    BasicTests::readNetworkTest("networks/sis33.m");
//    BasicTests::testRandomKeys("networks/sis33.m");
    BasicTests::Capacitor_Test_GA("networks/sis33.m");
}